

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::handleMessage
          (RpcConnectionState *this,Own<capnp::IncomingRpcMessage> *message)

{
  Reader value;
  bool bVar1;
  Which WVar2;
  uint uVar3;
  IncomingRpcMessage *pIVar4;
  Own<capnp::IncomingRpcMessage> *pOVar5;
  Own<capnp::_::VatNetworkBase::Connection> *this_00;
  Connection *pCVar6;
  OutgoingRpcMessage *pOVar7;
  MessageSize MVar8;
  Builder local_2a0;
  BuilderFor<capnp::rpc::Message> local_288;
  MessageSize local_250;
  Maybe<capnp::MessageSize> local_240;
  undefined1 local_228 [8];
  Own<capnp::OutgoingRpcMessage> message_1;
  Reader local_1e8;
  Reader local_1b8;
  Reader local_188;
  Reader local_158;
  Reader local_128;
  Reader local_f8;
  Reader local_c8;
  Reader local_98;
  Reader local_68;
  undefined1 auStack_48 [8];
  ReaderFor<capnp::rpc::Message> reader;
  Own<capnp::IncomingRpcMessage> *message_local;
  RpcConnectionState *this_local;
  
  reader._reader._40_8_ = message;
  pIVar4 = kj::Own<capnp::IncomingRpcMessage>::operator->(message);
  (**pIVar4->_vptr_IncomingRpcMessage)();
  AnyPointer::Reader::getAs<capnp::rpc::Message>
            ((ReaderFor<capnp::rpc::Message> *)auStack_48,&local_68);
  WVar2 = rpc::Message::Reader::which((ReaderFor<capnp::rpc::Message> *)auStack_48);
  switch(WVar2) {
  case UNIMPLEMENTED:
    rpc::Message::Reader::getUnimplemented(&local_98,(Reader *)auStack_48);
    handleUnimplemented(this,&local_98);
    break;
  case ABORT:
    rpc::Message::Reader::getAbort(&local_c8,(Reader *)auStack_48);
    handleAbort(this,&local_c8);
    break;
  case CALL:
    pOVar5 = kj::mv<kj::Own<capnp::IncomingRpcMessage>>(message);
    rpc::Message::Reader::getCall(&local_128,(Reader *)auStack_48);
    handleCall(this,pOVar5,&local_128);
    break;
  case RETURN:
    pOVar5 = kj::mv<kj::Own<capnp::IncomingRpcMessage>>(message);
    rpc::Message::Reader::getReturn(&local_158,(Reader *)auStack_48);
    handleReturn(this,pOVar5,&local_158);
    break;
  case FINISH:
    rpc::Message::Reader::getFinish(&local_188,(Reader *)auStack_48);
    handleFinish(this,&local_188);
    break;
  case RESOLVE:
    rpc::Message::Reader::getResolve(&local_1b8,(Reader *)auStack_48);
    handleResolve(this,&local_1b8);
    break;
  case RELEASE:
    rpc::Message::Reader::getRelease(&local_1e8,(Reader *)auStack_48);
    handleRelease(this,&local_1e8);
    break;
  default:
    bVar1 = kj::OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception>::
            is<kj::Own<capnp::_::VatNetworkBase::Connection>>
                      ((OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception> *)
                       &this->connection);
    if (bVar1) {
      this_00 = kj::OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception>::
                get<kj::Own<capnp::_::VatNetworkBase::Connection>>
                          ((OneOf<kj::Own<capnp::_::VatNetworkBase::Connection>,kj::Exception> *)
                           &this->connection);
      pCVar6 = kj::Own<capnp::_::VatNetworkBase::Connection>::operator->(this_00);
      MVar8 = rpc::Message::Reader::totalSize((Reader *)auStack_48);
      local_250.wordCount = MVar8.wordCount;
      local_250.capCount = MVar8.capCount;
      kj::Maybe<capnp::MessageSize>::Maybe(&local_240,&local_250);
      uVar3 = messageSizeHint<void>();
      uVar3 = firstSegmentSize(&local_240,uVar3);
      (**pCVar6->_vptr_Connection)(local_228,pCVar6,(ulong)uVar3);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_240);
      pOVar7 = kj::Own<capnp::OutgoingRpcMessage>::operator->
                         ((Own<capnp::OutgoingRpcMessage> *)local_228);
      (**pOVar7->_vptr_OutgoingRpcMessage)(&local_2a0);
      AnyPointer::Builder::initAs<capnp::rpc::Message>(&local_288,&local_2a0);
      value._reader.capTable = (CapTableReader *)reader._reader.segment;
      value._reader.segment = (SegmentReader *)auStack_48;
      value._reader.data = reader._reader.capTable;
      value._reader.pointers = (WirePointer *)reader._reader.data;
      value._reader._32_8_ = reader._reader.pointers;
      value._reader.nestingLimit = reader._reader.dataSize;
      value._reader._44_2_ = reader._reader.pointerCount;
      value._reader._46_2_ = reader._reader._38_2_;
      rpc::Message::Builder::setUnimplemented(&local_288,value);
      pOVar7 = kj::Own<capnp::OutgoingRpcMessage>::operator->
                         ((Own<capnp::OutgoingRpcMessage> *)local_228);
      (*pOVar7->_vptr_OutgoingRpcMessage[1])();
      kj::Own<capnp::OutgoingRpcMessage>::~Own((Own<capnp::OutgoingRpcMessage> *)local_228);
    }
    break;
  case BOOTSTRAP:
    pOVar5 = kj::mv<kj::Own<capnp::IncomingRpcMessage>>(message);
    rpc::Message::Reader::getBootstrap(&local_f8,(Reader *)auStack_48);
    handleBootstrap(this,pOVar5,&local_f8);
    break;
  case DISEMBARGO:
    rpc::Message::Reader::getDisembargo((Reader *)&message_1.ptr,(Reader *)auStack_48);
    handleDisembargo(this,(Reader *)&message_1.ptr);
  }
  return;
}

Assistant:

void handleMessage(kj::Own<IncomingRpcMessage> message) {
    auto reader = message->getBody().getAs<rpc::Message>();

    switch (reader.which()) {
      case rpc::Message::UNIMPLEMENTED:
        handleUnimplemented(reader.getUnimplemented());
        break;

      case rpc::Message::ABORT:
        handleAbort(reader.getAbort());
        break;

      case rpc::Message::BOOTSTRAP:
        handleBootstrap(kj::mv(message), reader.getBootstrap());
        break;

      case rpc::Message::CALL:
        handleCall(kj::mv(message), reader.getCall());
        break;

      case rpc::Message::RETURN:
        handleReturn(kj::mv(message), reader.getReturn());
        break;

      case rpc::Message::FINISH:
        handleFinish(reader.getFinish());
        break;

      case rpc::Message::RESOLVE:
        handleResolve(reader.getResolve());
        break;

      case rpc::Message::RELEASE:
        handleRelease(reader.getRelease());
        break;

      case rpc::Message::DISEMBARGO:
        handleDisembargo(reader.getDisembargo());
        break;

      default: {
        if (connection.is<Connected>()) {
          auto message = connection.get<Connected>()->newOutgoingMessage(
              firstSegmentSize(reader.totalSize(), messageSizeHint<void>()));
          message->getBody().initAs<rpc::Message>().setUnimplemented(reader);
          message->send();
        }
        break;
      }
    }
  }